

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void RGBA32PackedToPlanar_16b_SSE2(uint16_t *rgbx,__m128i *r,__m128i *g,__m128i *b)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  
  uVar13 = rgbx[1];
  uVar14 = rgbx[2];
  uVar15 = rgbx[4];
  uVar16 = rgbx[5];
  uVar17 = rgbx[6];
  uVar1 = rgbx[8];
  uVar2 = rgbx[9];
  uVar3 = rgbx[10];
  uVar4 = rgbx[0xc];
  uVar5 = rgbx[0xd];
  uVar6 = rgbx[0xe];
  uVar18 = rgbx[0x10];
  uVar19 = rgbx[0x11];
  uVar20 = rgbx[0x12];
  uVar21 = rgbx[0x14];
  uVar22 = rgbx[0x15];
  uVar23 = rgbx[0x16];
  uVar7 = rgbx[0x18];
  uVar8 = rgbx[0x19];
  uVar9 = rgbx[0x1a];
  uVar10 = rgbx[0x1c];
  uVar11 = rgbx[0x1d];
  uVar12 = rgbx[0x1e];
  *(uint16_t *)*r = *rgbx;
  *(uint16_t *)((long)*r + 2) = uVar15;
  *(uint16_t *)((long)*r + 4) = uVar1;
  *(uint16_t *)((long)*r + 6) = uVar4;
  *(uint16_t *)(*r + 1) = uVar18;
  *(uint16_t *)((long)*r + 10) = uVar21;
  *(uint16_t *)((long)*r + 0xc) = uVar7;
  *(uint16_t *)((long)*r + 0xe) = uVar10;
  *(uint16_t *)(*g + 1) = uVar13;
  *(uint16_t *)((long)*g + 10) = uVar16;
  *(uint16_t *)((long)*g + 0xc) = uVar2;
  *(uint16_t *)((long)*g + 0xe) = uVar5;
  *(uint16_t *)g[1] = uVar19;
  *(uint16_t *)((long)g[1] + 2) = uVar22;
  *(uint16_t *)((long)g[1] + 4) = uVar8;
  *(uint16_t *)((long)g[1] + 6) = uVar11;
  (*b)[0] = CONCAT26(uVar6,CONCAT24(uVar3,CONCAT22(uVar17,uVar14)));
  (*b)[1] = CONCAT26(uVar12,CONCAT24(uVar9,CONCAT22(uVar23,uVar20)));
  return;
}

Assistant:

static WEBP_INLINE void RGBA32PackedToPlanar_16b_SSE2(
    const uint16_t* WEBP_RESTRICT const rgbx,
    __m128i* const r, __m128i* const g, __m128i* const b) {
  const __m128i in0 = LOAD_16(rgbx +  0);  // r0 | g0 | b0 |x| r1 | g1 | b1 |x
  const __m128i in1 = LOAD_16(rgbx +  8);  // r2 | g2 | b2 |x| r3 | g3 | b3 |x
  const __m128i in2 = LOAD_16(rgbx + 16);  // r4 | ...
  const __m128i in3 = LOAD_16(rgbx + 24);  // r6 | ...
  // column-wise transpose
  const __m128i A0 = _mm_unpacklo_epi16(in0, in1);
  const __m128i A1 = _mm_unpackhi_epi16(in0, in1);
  const __m128i A2 = _mm_unpacklo_epi16(in2, in3);
  const __m128i A3 = _mm_unpackhi_epi16(in2, in3);
  const __m128i B0 = _mm_unpacklo_epi16(A0, A1);  // r0 r1 r2 r3 | g0 g1 ..
  const __m128i B1 = _mm_unpackhi_epi16(A0, A1);  // b0 b1 b2 b3 | x x x x
  const __m128i B2 = _mm_unpacklo_epi16(A2, A3);  // r4 r5 r6 r7 | g4 g5 ..
  const __m128i B3 = _mm_unpackhi_epi16(A2, A3);  // b4 b5 b6 b7 | x x x x
  *r = _mm_unpacklo_epi64(B0, B2);
  *g = _mm_unpackhi_epi64(B0, B2);
  *b = _mm_unpacklo_epi64(B1, B3);
}